

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiMenuColumns::Update(ImGuiMenuColumns *this,int count,float spacing,bool clear)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  if (this->Count < 5) {
    this->Count = count;
    this->Width = 0.0;
    this->NextWidth = 0.0;
    this->Spacing = spacing;
    if (clear) {
      this->NextWidths[0] = 0.0;
      this->NextWidths[1] = 0.0;
      this->NextWidths[2] = 0.0;
      this->NextWidths[3] = 0.0;
    }
    uVar1 = 0;
    uVar2 = (ulong)(uint)count;
    if (count < 1) {
      uVar2 = uVar1;
    }
    fVar3 = 0.0;
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      if (uVar1 == 0) {
        fVar4 = this->NextWidths[0];
      }
      else {
        fVar4 = this->NextWidths[uVar1];
        if (0.0 < fVar4) {
          fVar3 = fVar3 + spacing;
        }
      }
      this->Pos[uVar1] = (float)(int)fVar3;
      fVar3 = fVar3 + fVar4;
      this->Width = fVar3;
      this->NextWidths[uVar1] = 0.0;
    }
    return;
  }
  __assert_fail("Count <= ((int)(sizeof(Pos)/sizeof(*Pos)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x70d,"void ImGuiMenuColumns::Update(int, float, bool)");
}

Assistant:

void ImGuiMenuColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(Count <= IM_ARRAYSIZE(Pos));
    Count = count;
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear) memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < Count; i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = (float)(int)Width;
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}